

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O0

void Dsd_Decompose(Dsd_Manager_t *pDsdMan,DdNode **pbFuncs,int nFuncs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  abctime aVar5;
  Dsd_Node_t *pDVar6;
  abctime aVar7;
  int local_74;
  abctime clk_1;
  int nPrimeBlocks;
  int MaxBlock;
  int nCascades;
  int nReusedBlocksPres;
  int nExorGatesPrev;
  int nDecBlocksPrev;
  int nLiteralsPrev;
  int nCBFOutputs;
  int nDecOutputs;
  int SumMaxGateSize;
  Dsd_Node_t *pTemp;
  abctime clk;
  DdManager *pDStack_28;
  int i;
  DdManager *dd;
  DdNode **ppDStack_18;
  int nFuncs_local;
  DdNode **pbFuncs_local;
  Dsd_Manager_t *pDsdMan_local;
  
  pDStack_28 = pDsdMan->dd;
  nCBFOutputs = 0;
  nLiteralsPrev = 0;
  nDecBlocksPrev = 0;
  dd._4_4_ = nFuncs;
  ppDStack_18 = pbFuncs;
  pbFuncs_local = (DdNode **)pDsdMan;
  if (pDsdMan->nRootsAlloc < nFuncs) {
    if ((0 < pDsdMan->nRootsAlloc) && (pDsdMan->pRoots != (Dsd_Node_t **)0x0)) {
      free(pDsdMan->pRoots);
      pbFuncs_local[5] = (DdNode *)0x0;
    }
    *(uint *)(pbFuncs_local + 3) = dd._4_4_;
    pDVar4 = (DdNode *)malloc((long)*(int *)(pbFuncs_local + 3) << 3);
    pbFuncs_local[5] = pDVar4;
  }
  if (*(int *)(pbFuncs_local + 7) != 0) {
    printf("\nDecomposability statistics for individual outputs:\n");
  }
  s_nDecBlocks = 0;
  pTemp = (Dsd_Node_t *)Abc_Clock();
  *(undefined4 *)((long)pbFuncs_local + 0x14) = 0;
  s_nCascades = 0;
  for (clk._4_4_ = 0; (int)clk._4_4_ < (int)dd._4_4_; clk._4_4_ = clk._4_4_ + 1) {
    aVar5 = Abc_Clock();
    nExorGatesPrev = s_nLiterals;
    nReusedBlocksPres = s_nDecBlocks;
    nCascades = s_nExorGates;
    MaxBlock = s_nReusedBlocks;
    clk_1._0_4_ = s_nPrimeBlocks;
    pDVar6 = dsdKernelDecompose_rec((Dsd_Manager_t *)pbFuncs_local,ppDStack_18[(int)clk._4_4_]);
    iVar1 = *(int *)((long)pbFuncs_local + 0x14);
    *(int *)((long)pbFuncs_local + 0x14) = iVar1 + 1;
    *(Dsd_Node_t **)(&pbFuncs_local[5]->index + (long)iVar1 * 2) = pDVar6;
    Dsd_TreeNodeGetInfoOne
              (*(Dsd_Node_t **)(&pbFuncs_local[5]->index + (long)(int)clk._4_4_ * 2),&nPrimeBlocks,
               (int *)((long)&clk_1 + 4));
    if (s_nCascades < nPrimeBlocks) {
      local_74 = nPrimeBlocks;
    }
    else {
      local_74 = s_nCascades;
    }
    s_nCascades = local_74;
    _nDecOutputs = (int *)(*(ulong *)(&pbFuncs_local[5]->index + (long)(int)clk._4_4_ * 2) &
                          0xfffffffffffffffe);
    if ((*_nDecOutputs != 5) ||
       (iVar1 = _nDecOutputs[9],
       iVar2 = Extra_bddSuppSize(pDStack_28,*(DdNode **)(_nDecOutputs + 4)), (short)iVar1 != iVar2))
    {
      nLiteralsPrev = nLiteralsPrev + 1;
    }
    if ((int)clk_1._4_4_ < 3) {
      nDecBlocksPrev = nDecBlocksPrev + 1;
    }
    nCBFOutputs = clk_1._4_4_ + nCBFOutputs;
    if (*(int *)(pbFuncs_local + 7) != 0) {
      printf("#%02d: ",(ulong)clk._4_4_);
      uVar3 = Cudd_SupportSize(pDStack_28,ppDStack_18[(int)clk._4_4_]);
      printf("Ins=%2d. ",(ulong)uVar3);
      uVar3 = Dsd_TreeCountNonTerminalNodesOne
                        (*(Dsd_Node_t **)(&pbFuncs_local[5]->index + (long)(int)clk._4_4_ * 2));
      printf("Gts=%3d. ",(ulong)uVar3);
      uVar3 = Dsd_TreeCountPrimeNodesOne
                        (*(Dsd_Node_t **)(&pbFuncs_local[5]->index + (long)(int)clk._4_4_ * 2));
      printf("Pri=%3d. ",(ulong)uVar3);
      printf("Max=%3d. ",(ulong)clk_1._4_4_);
      printf("Reuse=%2d. ",(ulong)(uint)(s_nReusedBlocks - MaxBlock));
      printf("Csc=%2d. ",(ulong)(uint)nPrimeBlocks);
      aVar7 = Abc_Clock();
      printf("T= %.2f s. ",(double)((float)(aVar7 - aVar5) / 1e+06));
      uVar3 = Cudd_DagSize(ppDStack_18[(int)clk._4_4_]);
      printf("Bdd=%2d. ",(ulong)uVar3);
      printf("\n");
      fflush(_stdout);
    }
  }
  if (*(uint *)((long)pbFuncs_local + 0x14) != dd._4_4_) {
    __assert_fail("pDsdMan->nRoots == nFuncs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdProc.c"
                  ,0xc2,"void Dsd_Decompose(Dsd_Manager_t *, DdNode **, int)");
  }
  if (*(int *)(pbFuncs_local + 7) != 0) {
    printf("\n");
    printf("The cumulative decomposability statistics:\n");
    printf("  Total outputs                             = %5d\n",(ulong)dd._4_4_);
    printf("  Decomposable outputs                      = %5d\n",(ulong)(uint)nLiteralsPrev);
    printf("  Completely decomposable outputs           = %5d\n",(ulong)(uint)nDecBlocksPrev);
    printf("  The sum of max gate sizes                 = %5d\n",(ulong)(uint)nCBFOutputs);
    uVar3 = Cudd_SharingSize(ppDStack_18,dd._4_4_);
    printf("  Shared BDD size                           = %5d\n",(ulong)uVar3);
    printf("  Decomposition entries                     = %5d\n",
           (ulong)*(uint *)((long)&pbFuncs_local[1]->type + 4));
    aVar5 = Abc_Clock();
    printf("  Pure decomposition time                   =  %.2f sec\n",
           (double)((float)(aVar5 - (long)pTemp) / 1e+06));
  }
  return;
}

Assistant:

void Dsd_Decompose( Dsd_Manager_t * pDsdMan, DdNode ** pbFuncs, int nFuncs )
{
    DdManager * dd = pDsdMan->dd;
    int i;
    abctime clk;
    Dsd_Node_t * pTemp;
    int SumMaxGateSize = 0;
    int nDecOutputs = 0;
    int nCBFOutputs = 0;
/*
s_Loops1 = 0;
s_Loops2 = 0;
s_Loops3 = 0;
s_Case4Calls = 0;
s_Case4CallsSpecial = 0;
s_Case5 = 0;
s_Loops2Useless = 0;
*/
    // resize the number of roots in the manager
    if ( pDsdMan->nRootsAlloc < nFuncs )
    {
        if ( pDsdMan->nRootsAlloc > 0 )
            ABC_FREE( pDsdMan->pRoots );
        pDsdMan->nRootsAlloc = nFuncs;
        pDsdMan->pRoots = (Dsd_Node_t **) ABC_ALLOC( char, pDsdMan->nRootsAlloc * sizeof(Dsd_Node_t *) );
    }

    if ( pDsdMan->fVerbose )
        printf( "\nDecomposability statistics for individual outputs:\n" );

    // set the counter of decomposition nodes
    s_nDecBlocks = 0;

    // perform decomposition for all outputs
    clk = Abc_Clock();
    pDsdMan->nRoots = 0;
    s_nCascades = 0;
    for ( i = 0; i < nFuncs; i++ )
    {
        int nLiteralsPrev;
        int nDecBlocksPrev;
        int nExorGatesPrev;
        int nReusedBlocksPres;
        int nCascades;
        int MaxBlock;
        int nPrimeBlocks;
        abctime clk;

        clk = Abc_Clock();
        nLiteralsPrev     = s_nLiterals;
        nDecBlocksPrev    = s_nDecBlocks;
        nExorGatesPrev    = s_nExorGates;
        nReusedBlocksPres = s_nReusedBlocks;
        nPrimeBlocks      = s_nPrimeBlocks;

        pDsdMan->pRoots[ pDsdMan->nRoots++ ] = dsdKernelDecompose_rec( pDsdMan, pbFuncs[i] );

        Dsd_TreeNodeGetInfoOne( pDsdMan->pRoots[i], &nCascades, &MaxBlock );
        s_nCascades = ddMax( s_nCascades, nCascades );
        pTemp = Dsd_Regular(pDsdMan->pRoots[i]);
        if ( pTemp->Type != DSD_NODE_PRIME || pTemp->nDecs != Extra_bddSuppSize(dd,pTemp->S) )
            nDecOutputs++;
        if ( MaxBlock < 3 )
            nCBFOutputs++;
        SumMaxGateSize += MaxBlock;

        if ( pDsdMan->fVerbose )
        {
            printf("#%02d: ", i );                              
            printf("Ins=%2d. ", Cudd_SupportSize(dd,pbFuncs[i]) );                  
            printf("Gts=%3d. ", Dsd_TreeCountNonTerminalNodesOne( pDsdMan->pRoots[i] ) ); 
            printf("Pri=%3d. ", Dsd_TreeCountPrimeNodesOne( pDsdMan->pRoots[i] ) ); 
            printf("Max=%3d. ", MaxBlock ); 
            printf("Reuse=%2d. ", s_nReusedBlocks-nReusedBlocksPres ); 
            printf("Csc=%2d. ", nCascades ); 
            printf("T= %.2f s. ", (float)(Abc_Clock()-clk)/(float)(CLOCKS_PER_SEC) ) ;
            printf("Bdd=%2d. ", Cudd_DagSize(pbFuncs[i]) ); 
            printf("\n");
            fflush( stdout );
        }
    }
    assert( pDsdMan->nRoots == nFuncs );

    if ( pDsdMan->fVerbose )
    {
        printf( "\n" );
        printf( "The cumulative decomposability statistics:\n" );
        printf( "  Total outputs                             = %5d\n", nFuncs );
        printf( "  Decomposable outputs                      = %5d\n", nDecOutputs );
        printf( "  Completely decomposable outputs           = %5d\n", nCBFOutputs );
        printf( "  The sum of max gate sizes                 = %5d\n", SumMaxGateSize );
        printf( "  Shared BDD size                           = %5d\n", Cudd_SharingSize( pbFuncs, nFuncs ) );
        printf( "  Decomposition entries                     = %5d\n", st__count( pDsdMan->Table ) );
        printf( "  Pure decomposition time                   =  %.2f sec\n", (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC) );
    }
/*
    printf( "s_Loops1 = %d.\n", s_Loops1 );
    printf( "s_Loops2 = %d.\n", s_Loops2 );
    printf( "s_Loops3 = %d.\n", s_Loops3 );
    printf( "s_Case4Calls = %d.\n", s_Case4Calls );
    printf( "s_Case4CallsSpecial = %d.\n", s_Case4CallsSpecial );
    printf( "s_Case5 = %d.\n", s_Case5 );
    printf( "s_Loops2Useless = %d.\n", s_Loops2Useless );
*/
}